

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

MPP_RET open_client(Kmpp *ctx)

{
  RK_S32 RVar1;
  Kmpp *ctx_local;
  
  if (ctx == (Kmpp *)0x0) {
    ctx_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    RVar1 = mpp_vcodec_open();
    ctx->mClientFd = RVar1;
    if (ctx->mClientFd < 0) {
      _mpp_log_l(2,"kmpp","mpp_vcodec dev open failed\n",(char *)0x0);
      ctx_local._4_4_ = MPP_NOK;
    }
    else {
      ctx_local._4_4_ = MPP_OK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET open_client(Kmpp *ctx)
{
    if (!ctx)
        return MPP_ERR_VALUE;

    ctx->mClientFd = mpp_vcodec_open();
    if (ctx->mClientFd < 0) {
        mpp_err("mpp_vcodec dev open failed\n");
        return MPP_NOK;
    }
    return MPP_OK;
}